

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateNotImplementedMethods
          (ServiceGenerator *this,Printer *printer)

{
  long *plVar1;
  MethodDescriptor *pMVar2;
  cpp *pcVar3;
  long *plVar4;
  _Array_type *in_RCX;
  ServiceDescriptor *this_00;
  long lVar5;
  undefined8 uStack_310;
  anon_class_1_0_00000001 local_305;
  int local_304;
  undefined1 local_300 [32];
  string local_2e0;
  string local_2c0;
  Printer *local_2a0;
  string local_298;
  string local_278;
  Sub local_258;
  Sub local_1a0;
  Sub local_e8;
  
  this_00 = this->descriptor_;
  if (0 < *(int *)(this_00 + 0x38)) {
    local_304 = 0;
    local_2a0 = printer;
    do {
      uStack_310 = 0x230482;
      pMVar2 = ServiceDescriptor::method(this_00,local_304);
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      uStack_310 = 0x2304aa;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"name","");
      uStack_310 = 0x2304be;
      io::Printer::Sub::Sub<std::__cxx11::string_const&>
                (&local_258,&local_2c0,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pMVar2 + 8)
                );
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      uStack_310 = 0x2304e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"input","");
      uStack_310 = 0x2304eb;
      pcVar3 = (cpp *)google::protobuf::MethodDescriptor::input_type();
      uStack_310 = 0x2304fd;
      QualifiedClassName_abi_cxx11_
                (&local_278,pcVar3,(Descriptor *)this->options_,(Options *)in_RCX);
      uStack_310 = 0x23050d;
      io::Printer::Sub::Sub<std::__cxx11::string>(&local_1a0,&local_2e0,&local_278);
      local_300._0_8_ = local_300 + 0x10;
      uStack_310 = 0x23052f;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"output","");
      uStack_310 = 0x230537;
      pcVar3 = (cpp *)google::protobuf::MethodDescriptor::output_type();
      uStack_310 = 0x23054b;
      QualifiedClassName_abi_cxx11_
                (&local_298,pcVar3,(Descriptor *)this->options_,(Options *)in_RCX);
      uStack_310 = 0x230560;
      io::Printer::Sub::Sub<std::__cxx11::string>(&local_e8,(string *)local_300,&local_298);
      uStack_310 = 0x230583;
      google::protobuf::io::Printer::Emit
                (local_2a0,&local_258,3,0x124,
                 "\n          void $classname$::$name$(::$proto_ns$::RpcController* controller,\n                                   const $input$*, $output$*, ::google::protobuf::Closure* done) {\n            controller->SetFailed(\"Method $name$() not implemented.\");\n            done->Run();\n          }\n        "
                );
      lVar5 = 0x228;
      do {
        if (local_278.field_2._M_local_buf[lVar5 + 8] == '\x01') {
          uStack_310 = 0x2305a1;
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     ((long)&local_2a0 + lVar5));
        }
        plVar4 = (long *)((long)&local_2c0._M_string_length + lVar5);
        plVar1 = *(long **)((long)&local_2e0.field_2 + lVar5 + 8);
        if (plVar4 != plVar1) {
          uStack_310 = 0x2305bd;
          operator_delete(plVar1,*plVar4 + 1);
        }
        in_RCX = &std::__detail::__variant::
                  __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
                  ::_S_vtable;
        uStack_310 = 0x2305d6;
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[(byte)local_2e0.field_2._M_local_buf[lVar5]]._M_data)
                  (&local_305,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)(local_300 + lVar5 + 0x10));
        local_2e0.field_2._M_local_buf[lVar5] = -1;
        if ((long *)(local_300 + lVar5) != *(long **)((long)&uStack_310 + lVar5)) {
          uStack_310 = 0x2305f6;
          operator_delete(*(long **)((long)&uStack_310 + lVar5),*(long *)(local_300 + lVar5) + 1);
        }
        lVar5 = lVar5 + -0xb8;
      } while (lVar5 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        uStack_310 = 0x230621;
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
        uStack_310 = 0x23063d;
        operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        uStack_310 = 0x230662;
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        uStack_310 = 0x23067e;
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        uStack_310 = 0x23069a;
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      local_304 = local_304 + 1;
      this_00 = this->descriptor_;
    } while (local_304 < *(int *)(this_00 + 0x38));
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateNotImplementedMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); ++i) {
    const MethodDescriptor* method = descriptor_->method(i);

    printer->Emit(
        {
            {"name", method->name()},
            {"input", QualifiedClassName(method->input_type(), *options_)},
            {"output", QualifiedClassName(method->output_type(), *options_)},
        },
        R"cc(
          void $classname$::$name$(::$proto_ns$::RpcController* controller,
                                   const $input$*, $output$*, ::google::protobuf::Closure* done) {
            controller->SetFailed("Method $name$() not implemented.");
            done->Run();
          }
        )cc");
  }
}